

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O2

void __thiscall net_uv::KCPSocket::connectResult(KCPSocket *this,int32_t status)

{
  if ((this->super_Socket).m_connectCall.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(net_uv::Socket_*,_int)>::operator()
              (&(this->super_Socket).m_connectCall,&this->super_Socket,status);
  }
  if (status == 1) {
    return;
  }
  changeState(this,CLOSED);
  shutdownSocket(this);
  return;
}

Assistant:

void KCPSocket::connectResult(int32_t status)
{
	if (m_connectCall)
		m_connectCall(this, status);

	if (status != 1)
	{
		this->changeState(State::CLOSED);
		this->shutdownSocket();
	}
}